

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  long lVar1;
  code *pcVar2;
  anon_class_16_2_f79d628a fn;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint32 local_34;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSStack_30;
  uint32 count;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list;
  BucketData<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *bucketData;
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *heapBucket_local;
  RecyclerSweep *this_local;
  
  bucketData = (BucketData<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)heapBucket;
  heapBucket_local =
       (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
        *)this;
  bVar4 = IsBackground(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbe,"(!this->IsBackground())","!this->IsBackground()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar4 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          ::IsAllocationStopped
                    ((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                      *)bucketData);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbf,"(!heapBucket->IsAllocationStopped())",
                       "!heapBucket->IsAllocationStopped()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            ((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *)bucketData,false);
  list = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
         GetBucketData<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                   (this,(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          *)bucketData);
  if (((BucketData<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *
       )list)->pendingSweepList !=
      (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xc3,"(bucketData.pendingSweepList == nullptr)",
                       "bucketData.pendingSweepList == nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  tail = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
         (list->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
         super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
         super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.segment;
  if ((Segment *)tail == (Segment *)0x0) {
    pSVar3 = &list->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>;
    lVar1._0_1_ = (pSVar3->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  heapBlockType;
    lVar1._1_1_ = (pSVar3->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  needOOMRescan;
    lVar1._2_1_ = (pSVar3->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  isPendingConcurrentSweep;
    lVar1._3_1_ = (pSVar3->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  isForceSweeping;
    lVar1._4_4_ = *(undefined4 *)
                   &(pSVar3->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.field_0x1c
    ;
    if (lVar1 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xe2,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                         "bucketData.pendingEmptyBlockListTail == nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    pSStack_30 = *(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> **)
                  &(list->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
                   super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
                   super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                   heapBlockType;
    local_34 = 0;
    fn.count = &local_34;
    fn.tail = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)pSStack_30;
    HeapBlockList::
    ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
              (tail,fn);
    *(uint32 *)((long)&bucketData->pendingEmptyBlockList + 4) =
         local_34 + *(int *)((long)&bucketData->pendingEmptyBlockList + 4);
    *(uint32 *)((long)&bucketData->pendingFinalizableSweptList + 4) =
         *(int *)((long)&bucketData->pendingFinalizableSweptList + 4) - local_34;
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock
              (pSStack_30,
               &(bucketData[2].pendingEmptyBlockListTail)->
                super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>);
    bucketData[2].pendingEmptyBlockListTail = tail;
    (list->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.segment = (Segment *)0x0;
    HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
    VerifyHeapBlockCount
              ((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)bucketData,false);
  }
  return;
}

Assistant:

void
RecyclerSweep::TransferPendingEmptyHeapBlocks(HeapBucketT<TBlockType> * heapBucket)
{
    Assert(!this->IsBackground());
    Assert(!heapBucket->IsAllocationStopped());
    RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));

    auto& bucketData = this->GetBucketData(heapBucket);
    Assert(bucketData.pendingSweepList == nullptr);
    TBlockType * list = bucketData.pendingEmptyBlockList;
    if (list)
    {
        TBlockType * tail = bucketData.pendingEmptyBlockListTail;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        uint32 count = 0;
        HeapBlockList::ForEach(list, [tail, &count](TBlockType * heapBlock)
        {
            Assert(heapBlock->GetAddress() == nullptr);
            Assert(heapBlock->GetSegment() == nullptr);
            Assert(heapBlock->GetNextBlock() != nullptr || heapBlock == tail);
            count++;
        });
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        heapBucket->emptyHeapBlockCount += count;
#endif
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        heapBucket->heapBlockCount -= count;
#endif
#endif


        tail->SetNextBlock(heapBucket->emptyBlockList);
        heapBucket->emptyBlockList = list;

        bucketData.pendingEmptyBlockList = nullptr;
        RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));
    }
    else
    {
        Assert(bucketData.pendingEmptyBlockListTail == nullptr);
    }
}